

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LogLevel LVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type in_RSI;
  int ret;
  string filter;
  char *googleArgv [4];
  int googleArgc;
  anon_class_1_0_00000001 onError;
  char **origArgv;
  bool listTests;
  string testFilter;
  string logLevel;
  PBRTOptions opt;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  PBRTOptions *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  byte in_stack_fffffffffffffc2f;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  allocator<char> *in_stack_fffffffffffffc58;
  PBRTOptions *in_stack_fffffffffffffc60;
  bool local_381;
  string local_358 [32];
  string local_338 [32];
  long local_318 [4];
  int local_2f4;
  string local_2f0 [32];
  undefined4 local_2d0;
  allocator<char> local_2c9;
  string local_2c8 [39];
  _Alloc_hider local_2a1;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_2a0;
  byte local_27b;
  byte local_27a;
  undefined1 local_279 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_251 [2];
  undefined1 local_22b;
  undefined1 local_22a;
  allocator<char> local_229;
  string local_228 [24];
  undefined8 in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 uVar9;
  undefined8 in_stack_fffffffffffffe00;
  char ***in_stack_fffffffffffffe08;
  allocator<char> local_1d9;
  string local_1d8 [71];
  allocator<char> local_191;
  string local_190 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_168;
  string local_158 [55];
  allocator<char> local_121;
  string local_120 [41];
  undefined1 local_f7;
  LogLevel local_ec;
  long *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = (long *)in_RSI;
  pbrt::PBRTOptions::PBRTOptions(in_stack_fffffffffffffc20);
  local_f7 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::string(local_158);
  local_168._M_local_buf[0xf] = 0;
  local_168._M_allocated_capacity = (size_type)local_10;
  local_10 = (long *)((long)local_10 + 8);
  do {
    if (*local_10 == 0) {
      LVar5 = pbrt::LogLevelFromString
                        ((string *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      local_ec = LVar5;
      pbrt::InitPBRT(in_stack_fffffffffffffc60);
      local_2f4 = 1;
      memset(local_318,0,0x20);
      local_318[0] = *local_10;
      std::__cxx11::string::string(local_338);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pbrt::StringPrintf<std::__cxx11::string&>
                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        std::__cxx11::string::operator=(local_338,local_358);
        std::__cxx11::string::~string(local_358);
        lVar7 = std::__cxx11::string::c_str();
        lVar8 = (long)local_2f4;
        local_2f4 = local_2f4 + 1;
        local_318[lVar8] = lVar7;
      }
      if ((local_168._M_local_buf[0xf] & 1U) != 0) {
        lVar7 = (long)local_2f4;
        local_2f4 = local_2f4 + 1;
        local_318[lVar7] = (long)"--gtest_list_tests";
      }
      testing::InitGoogleTest
                ((int *)in_stack_fffffffffffffc20,(char **)CONCAT44(LVar5,in_stack_fffffffffffffc18)
                );
      iVar4 = RUN_ALL_TESTS();
      pbrt::CleanupPBRT();
      local_2d0 = 1;
      local_4 = iVar4;
      std::__cxx11::string::~string(local_338);
      goto LAB_004efd62;
    }
    std::allocator<char>::allocator();
    bVar2 = false;
    bVar1 = false;
    uVar9 = 0;
    local_22a = 0;
    local_22b = 0;
    local_251[0]._M_local_buf[0] = 0;
    local_27a = 0;
    local_27b = 0;
    local_2a1 = (_Alloc_hider)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    std::function<void(std::__cxx11::string)>::function<main::__0&,void>
              (in_stack_fffffffffffffc30,
               (anon_class_1_0_00000001 *)
               CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
    bVar3 = pbrt::ParseArg<bool*>
                      (in_stack_fffffffffffffe08,(string *)in_stack_fffffffffffffe00,
                       (bool *)CONCAT17(uVar9,in_stack_fffffffffffffdf8),
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)in_stack_fffffffffffffdf0);
    local_381 = true;
    if (!bVar3) {
      std::allocator<char>::allocator();
      bVar2 = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
      bVar1 = true;
      in_stack_fffffffffffffc60 = (PBRTOptions *)&stack0xfffffffffffffe00;
      std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                (in_stack_fffffffffffffc30,
                 (anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
      uVar9 = 1;
      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                        (in_stack_fffffffffffffe08,(string *)in_stack_fffffffffffffe00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(1,in_stack_fffffffffffffdf8),
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)in_stack_fffffffffffffdf0);
      local_381 = true;
      if (!bVar3) {
        in_stack_fffffffffffffc58 = &local_229;
        std::allocator<char>::allocator();
        local_22a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50))
        ;
        local_22b = 1;
        in_stack_fffffffffffffc48 = local_251[0]._M_local_buf + 1;
        std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                  (in_stack_fffffffffffffc30,
                   (anon_class_1_0_00000001 *)
                   CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
        local_251[0]._M_local_buf[0] = 1;
        in_stack_fffffffffffffc57 =
             pbrt::ParseArg<int*>
                       (in_stack_fffffffffffffe08,(string *)in_stack_fffffffffffffe00,
                        (int *)CONCAT17(uVar9,in_stack_fffffffffffffdf8),
                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                         *)in_stack_fffffffffffffdf0);
        local_381 = true;
        if (!(bool)in_stack_fffffffffffffc57) {
          in_stack_fffffffffffffc40 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_279;
          std::allocator<char>::allocator();
          local_27a = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          local_27b = 1;
          in_stack_fffffffffffffc30 = &local_2a0;
          std::function<void(std::__cxx11::string)>::function<main::__0&,void>
                    (in_stack_fffffffffffffc30,
                     (anon_class_1_0_00000001 *)
                     CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
          local_2a1 = (_Alloc_hider)0x1;
          local_381 = pbrt::ParseArg<std::__cxx11::string*>
                                (in_stack_fffffffffffffe08,(string *)in_stack_fffffffffffffe00,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(uVar9,in_stack_fffffffffffffdf8),
                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)in_stack_fffffffffffffdf0);
        }
      }
    }
    in_stack_fffffffffffffc2f = local_381;
    if (((byte)local_2a1 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x4ef787);
      in_stack_fffffffffffffc2f = local_381;
    }
    if ((local_27b & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_279 + 1));
    }
    if ((local_27a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_279);
    }
    if ((local_251[0]._M_local_buf[0] & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x4ef7d2);
    }
    if ((local_22b & 1) != 0) {
      std::__cxx11::string::~string(local_228);
    }
    if ((local_22a & 1) != 0) {
      std::allocator<char>::~allocator(&local_229);
    }
    if ((uVar9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x4ef81d);
    }
    if (bVar1) {
      std::__cxx11::string::~string(local_1d8);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(&local_1d9);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x4ef85c);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
  } while ((in_stack_fffffffffffffc2f & 1) != 0);
  iVar4 = strcmp((char *)*local_10,"--help");
  if ((iVar4 == 0) || (iVar4 = strcmp((char *)*local_10,"-h"), iVar4 == 0)) {
    in_stack_fffffffffffffc20 = (PBRTOptions *)&local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    usage((string *)in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    local_4 = 0;
    local_2d0 = 1;
  }
  else {
    pbrt::StringPrintf<char*&>(in_stack_fffffffffffffc48,(char **)in_stack_fffffffffffffc40);
    usage((string *)in_stack_fffffffffffffc20);
    std::__cxx11::string::~string(local_2f0);
    local_4 = 1;
    local_2d0 = 1;
  }
LAB_004efd62:
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_120);
  pbrt::PBRTOptions::~PBRTOptions(in_stack_fffffffffffffc20);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
    PBRTOptions opt;
    opt.quiet = true;
    std::string logLevel = "error";
    std::string testFilter;
    bool listTests = false;

    char **origArgv = argv;
    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        if (ParseArg(&argv, "list-tests", &listTests, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "nthreads", &opt.nThreads, onError) ||
            ParseArg(&argv, "test-filter", &testFilter, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    opt.logLevel = LogLevelFromString(logLevel);

    InitPBRT(opt);

    int googleArgc = 1;
    const char *googleArgv[4] = {};
    googleArgv[0] = argv[0];
    std::string filter;
    if (!testFilter.empty()) {
        filter = StringPrintf("--gtest_filter=%s", testFilter);
        googleArgv[googleArgc++] = filter.c_str();
    }
    if (listTests)
        googleArgv[googleArgc++] = "--gtest_list_tests";

    testing::InitGoogleTest(&googleArgc, (char **)googleArgv);

    int ret = RUN_ALL_TESTS();

    CleanupPBRT();

    return ret;
}